

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_disk_secure744.c
# Opt level: O1

void test_write_disk_secure744(void)

{
  byte *pbVar1;
  int iVar2;
  wchar_t wVar3;
  byte *__s;
  archive *_a;
  archive_entry *paVar4;
  size_t sVar5;
  uint uVar6;
  ulong uVar7;
  char cVar8;
  size_t __maxlen;
  ulong uVar9;
  
  __s = (byte *)malloc(0x2000);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_secure744.c"
                   ,L'/',(uint)(__s != (byte *)0x0),"buff != NULL",(void *)0x0);
  assertion_umask("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_secure744.c"
                  ,L'2',L'\x12');
  _a = archive_write_disk_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_secure744.c"
                   ,L'5',(uint)(_a != (archive *)0x0),"(a = archive_write_disk_new()) != NULL",
                   (void *)0x0);
  archive_write_disk_set_options(_a,L'Ā');
  cVar8 = '0';
  __maxlen = 0x1f9b;
  uVar7 = 0;
  uVar9 = 0;
  do {
    if (0x1e0b < uVar9) break;
    pbVar1 = __s + uVar9 + 0x50;
    pbVar1[0] = 0x78;
    pbVar1[1] = 0x78;
    pbVar1[2] = 0x78;
    pbVar1[3] = 0x78;
    pbVar1[4] = 0x78;
    pbVar1[5] = 0x78;
    pbVar1[6] = 0x78;
    pbVar1[7] = 0x78;
    pbVar1[8] = 0x78;
    pbVar1[9] = 0x78;
    pbVar1[10] = 0x78;
    pbVar1[0xb] = 0x78;
    pbVar1[0xc] = 0x78;
    pbVar1[0xd] = 0x78;
    pbVar1[0xe] = 0x78;
    pbVar1[0xf] = 0x78;
    pbVar1 = __s + uVar9 + 0x40;
    pbVar1[0] = 0x78;
    pbVar1[1] = 0x78;
    pbVar1[2] = 0x78;
    pbVar1[3] = 0x78;
    pbVar1[4] = 0x78;
    pbVar1[5] = 0x78;
    pbVar1[6] = 0x78;
    pbVar1[7] = 0x78;
    pbVar1[8] = 0x78;
    pbVar1[9] = 0x78;
    pbVar1[10] = 0x78;
    pbVar1[0xb] = 0x78;
    pbVar1[0xc] = 0x78;
    pbVar1[0xd] = 0x78;
    pbVar1[0xe] = 0x78;
    pbVar1[0xf] = 0x78;
    pbVar1 = __s + uVar9 + 0x30;
    pbVar1[0] = 0x78;
    pbVar1[1] = 0x78;
    pbVar1[2] = 0x78;
    pbVar1[3] = 0x78;
    pbVar1[4] = 0x78;
    pbVar1[5] = 0x78;
    pbVar1[6] = 0x78;
    pbVar1[7] = 0x78;
    pbVar1[8] = 0x78;
    pbVar1[9] = 0x78;
    pbVar1[10] = 0x78;
    pbVar1[0xb] = 0x78;
    pbVar1[0xc] = 0x78;
    pbVar1[0xd] = 0x78;
    pbVar1[0xe] = 0x78;
    pbVar1[0xf] = 0x78;
    pbVar1 = __s + uVar9 + 0x20;
    pbVar1[0] = 0x78;
    pbVar1[1] = 0x78;
    pbVar1[2] = 0x78;
    pbVar1[3] = 0x78;
    pbVar1[4] = 0x78;
    pbVar1[5] = 0x78;
    pbVar1[6] = 0x78;
    pbVar1[7] = 0x78;
    pbVar1[8] = 0x78;
    pbVar1[9] = 0x78;
    pbVar1[10] = 0x78;
    pbVar1[0xb] = 0x78;
    pbVar1[0xc] = 0x78;
    pbVar1[0xd] = 0x78;
    pbVar1[0xe] = 0x78;
    pbVar1[0xf] = 0x78;
    pbVar1 = __s + uVar9 + 0x10;
    pbVar1[0] = 0x78;
    pbVar1[1] = 0x78;
    pbVar1[2] = 0x78;
    pbVar1[3] = 0x78;
    pbVar1[4] = 0x78;
    pbVar1[5] = 0x78;
    pbVar1[6] = 0x78;
    pbVar1[7] = 0x78;
    pbVar1[8] = 0x78;
    pbVar1[9] = 0x78;
    pbVar1[10] = 0x78;
    pbVar1[0xb] = 0x78;
    pbVar1[0xc] = 0x78;
    pbVar1[0xd] = 0x78;
    pbVar1[0xe] = 0x78;
    pbVar1[0xf] = 0x78;
    pbVar1 = __s + uVar9;
    pbVar1[0] = 0x78;
    pbVar1[1] = 0x78;
    pbVar1[2] = 0x78;
    pbVar1[3] = 0x78;
    pbVar1[4] = 0x78;
    pbVar1[5] = 0x78;
    pbVar1[6] = 0x78;
    pbVar1[7] = 0x78;
    pbVar1[8] = 0x78;
    pbVar1[9] = 0x78;
    pbVar1[10] = 0x78;
    pbVar1[0xb] = 0x78;
    pbVar1[0xc] = 0x78;
    pbVar1[0xd] = 0x78;
    pbVar1[0xe] = 0x78;
    pbVar1[0xf] = 0x78;
    pbVar1 = __s + uVar9 + 0x60;
    pbVar1[0] = 0x78;
    pbVar1[1] = 0x78;
    pbVar1[2] = 0x78;
    pbVar1[3] = 0x78;
    __s[uVar9 + 100] = 0;
    *__s = (char)(uVar7 / 1000) + (char)((uVar7 / 1000) * 0x1999999a >> 0x20) * -10 | 0x30;
    __s[1] = (char)(uVar7 / 100) + (char)((uVar7 / 100) * 0x1999999a >> 0x20) * -10 | 0x30;
    __s[2] = (char)(uVar7 / 10) + (char)((uVar7 / 10) * 0x1999999a >> 0x20) * -10 | 0x30;
    __s[3] = cVar8 + (char)(uVar7 / 10) * -10;
    __s[4] = 0x5f;
    uVar6 = (int)uVar7 + 1;
    uVar7 = (ulong)uVar6;
    paVar4 = archive_entry_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_secure744.c"
                     ,L'E',(uint)(paVar4 != (archive_entry *)0x0),
                     "(ae = archive_entry_new()) != NULL",(void *)0x0);
    archive_entry_copy_pathname(paVar4,(char *)__s);
    archive_entry_set_mode(paVar4,0x81ff);
    archive_entry_copy_symlink(paVar4,testworkdir);
    iVar2 = archive_write_header(_a,paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_secure744.c"
                        ,L'I',0,"ARCHIVE_OK",(long)iVar2,"archive_write_header(a, ae)",_a);
    archive_entry_free(paVar4);
    __s[uVar9 + 100] = 0x2f;
    snprintf((char *)(__s + uVar9 + 0x65),__maxlen,"target%d",uVar7);
    paVar4 = archive_entry_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_secure744.c"
                     ,L'P',(uint)(paVar4 != (archive_entry *)0x0),
                     "(ae = archive_entry_new()) != NULL",(void *)0x0);
    archive_entry_copy_pathname(paVar4,(char *)__s);
    archive_entry_set_mode(paVar4,0x41ff);
    iVar2 = archive_write_header(_a,paVar4);
    archive_entry_free(paVar4);
    sVar5 = strlen((char *)__s);
    failure("Attempt to create target%d via %d-character symlink should have failed",(ulong)uVar6,
            sVar5 & 0xffffffff);
    wVar3 = assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_secure744.c"
                                ,L'W',-0x19,"ARCHIVE_FAILED",(long)iVar2,"t",(void *)0x0);
    cVar8 = cVar8 + '\x01';
    __maxlen = __maxlen - 0x65;
    uVar9 = uVar9 + 0x65;
  } while (wVar3 != L'\0');
  archive_free(_a);
  free(__s);
  return;
}

Assistant:

DEFINE_TEST(test_write_disk_secure744)
{
#if defined(_WIN32) && !defined(__CYGWIN__)
	skipping("archive_write_disk security checks not supported on Windows");
#else
	struct archive *a;
	struct archive_entry *ae;
	size_t buff_size = 8192;
	char *buff = malloc(buff_size);
	char *p = buff;
	int n = 0;
	int t;

	assert(buff != NULL);

	/* Start with a known umask. */
	assertUmask(UMASK);

	/* Create an archive_write_disk object. */
	assert((a = archive_write_disk_new()) != NULL);
	archive_write_disk_set_options(a, ARCHIVE_EXTRACT_SECURE_SYMLINKS);

	while (p + 500 < buff + buff_size) {
		memset(p, 'x', 100);
		p += 100;
		p[0] = '\0';

		buff[0] = ((n / 1000) % 10) + '0';
		buff[1] = ((n / 100) % 10)+ '0';
		buff[2] = ((n / 10) % 10)+ '0';
		buff[3] = ((n / 1) % 10)+ '0';
		buff[4] = '_';
		++n;

		/* Create a symlink pointing to the testworkdir */
		assert((ae = archive_entry_new()) != NULL);
		archive_entry_copy_pathname(ae, buff);
		archive_entry_set_mode(ae, S_IFREG | 0777);
		archive_entry_copy_symlink(ae, testworkdir);
		assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
		archive_entry_free(ae);

		*p++ = '/';
		snprintf(p, buff_size - (p - buff), "target%d", n);

		/* Try to create a file through the symlink, should fail. */
		assert((ae = archive_entry_new()) != NULL);
		archive_entry_copy_pathname(ae, buff);
		archive_entry_set_mode(ae, S_IFDIR | 0777);

		t = archive_write_header(a, ae);
		archive_entry_free(ae);
		failure("Attempt to create target%d via %d-character symlink should have failed", n, (int)strlen(buff));
		if(!assertEqualInt(ARCHIVE_FAILED, t)) {
			break;
		}
	}
	archive_free(a);
	free(buff);
#endif
}